

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestLoopTag1(QTest *test)

{
  SizeT *pSVar1;
  Value<char> *pVVar2;
  long lVar3;
  TagBit *pTVar4;
  undefined8 uVar5;
  char *pcVar6;
  QTest *pQVar7;
  uint uVar8;
  Value<char> *pVVar9;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar10;
  long lVar11;
  Value<char> value1;
  Array<Qentem::Tags::TagBit> tags_cache_5;
  Value<char> value2;
  StringStream<char> ss;
  Value<char> value3;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_e8;
  char local_d8;
  Array<Qentem::Tags::TagBit> local_c8;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_b8;
  char local_a8;
  StringStream<char> local_98;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_88;
  undefined8 local_78;
  char *local_70;
  SizeT local_68;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_58;
  char local_48;
  QTest *local_38;
  
  local_d8 = 0;
  local_48 = '\0';
  local_98.storage_ = (char *)0x0;
  local_98.length_ = 0;
  local_98.capacity_ = 0;
  local_e8.array_.storage_ = (Value<char> *)0x0;
  local_e8._8_8_ = 0;
  local_58.array_.storage_ = (Value<char> *)0x0;
  local_58._8_8_ = 0;
  Value<char>::reset((Value<char> *)&local_e8.array_);
  local_d8 = '\x03';
  local_88.number_ = (QNumber64)0x64;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0xffffffffffffffce;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)&local_b8.array_,"Qentem");
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = local_b8.array_.storage_;
  local_88.array_.index_ = local_b8.array_.index_;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_78 = CONCAT71(local_78._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  uVar5 = local_b8.array_.storage_;
  if (local_b8.array_.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8.number_);
  }
  operator_delete((void *)uVar5);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,8);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,9);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,10);
  local_38 = test;
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0x3;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  local_68 = 0x34;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,
             (Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[41]>
            (local_38,&local_98,(char (*) [41])"100, -50, Qentem, true, false, null, 3, ",0xb1a);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>";
  local_68 = 0x4e;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>",0x4e
             ,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char>,char[74]>
            (pQVar7,&local_98,
             (char (*) [74])
             "100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1f);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_e8.array_);
  local_d8 = 0;
  Value<char>::reset((Value<char> *)&local_e8.array_);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_d8 = '\x03';
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0x1;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char>_>::operator+=(&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  lVar11 = 0;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while ("<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
           [lVar3] != '\0');
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  "<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (local_38,&local_98,(char (*) [29])"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb2a);
  lVar11 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while ("<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
           [lVar3] != '\0');
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  "<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char>,char[81]>
            (pQVar7,&local_98,
             (char (*) [81])
             "(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb30);
  lVar11 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while ("<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
           [lVar3] != '\0');
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  "<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char>,char[209]>
            (pQVar7,&local_98,
             (char (*) [209])
             "(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb38);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char> *)&local_b8.array_,
             "[100, -50, \"A\", true, false, null]",0x22);
  uVar5 = local_b8.array_.storage_;
  if (local_b8.array_.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8.number_);
  }
  operator_delete((void *)uVar5);
  Value<char>::operator=((Value<char> *)&local_e8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_b8.array_,(StringStream<char> *)&local_88.array_,
             "{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
             ,0x47);
  uVar5 = local_88.array_.storage_;
  if (local_88.array_.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_88.number_);
  }
  operator_delete((void *)uVar5);
  if (local_48 != '\x02') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x02';
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,"arr1",
                      4);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char>::reset(pVVar9);
    Value<char>::copyValue(pVVar9,(Value<char> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (local_38,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb45);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_78 = 0;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_b8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb49);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb4d);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x02';
  }
  paVar10 = &HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,
                        "arr1",4)->field_0;
  if (paVar10 != &local_b8) {
    Value<char>::reset((Value<char> *)&paVar10->array_);
    Value<char>::copyValue((Value<char> *)&paVar10->array_,(Value<char> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = "<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (local_38,&local_98,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb53);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x02';
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,"arr1",
                      4);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char>::reset(pVVar9);
    Value<char>::copyValue(pVVar9,(Value<char> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\" >{var:loop1-value}, </loop>";
  local_68 = 0x35;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",0x35,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (local_38,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb5a);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_b8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb5e);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>";
  local_68 = 0x3e;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",0x3e,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb62);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char>::reset((Value<char> *)&local_58.array_);
    local_48 = '\x02';
  }
  paVar10 = &HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,
                        "arr1",4)->field_0;
  if (paVar10 != &local_b8) {
    Value<char>::reset((Value<char> *)&paVar10->array_);
    Value<char>::copyValue((Value<char> *)&paVar10->array_,(Value<char> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = "<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (local_38,&local_98,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb68);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 0;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 2;
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,"arr1",
                      4);
  if (pVVar9->type_ != Object) {
    Value<char>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,"arr2",4);
  if (pVVar9->type_ != Object) {
    Value<char>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,"arr3",4);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char>::reset(pVVar9);
    Value<char>::copyValue(pVVar9,(Value<char> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = "<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x4b;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x4b,
             &local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb70);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 0;
  pVVar9 = Value<char>::operator[]((Value<char> *)&local_58.array_,0);
  pVVar9 = Value<char>::operator[](pVVar9,0);
  if (pVVar9->type_ == Array) {
LAB_00118474:
    uVar8 = (pVVar9->field_0).array_.index_;
    if (uVar8 == (pVVar9->field_0).array_.capacity_) {
      Array<Qentem::Value<char>_>::resize
                ((Array<Qentem::Value<char>_> *)pVVar9,(uVar8 == 0 | uVar8) * 2);
      uVar8 = (pVVar9->field_0).array_.index_;
    }
    pVVar2 = (pVVar9->field_0).array_.storage_ + uVar8;
    (pVVar2->field_0).array_.storage_ = (Value<char> *)0x0;
    *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
    pVVar2->type_ = Undefined;
    Value<char>::copyValue(pVVar2,(Value<char> *)&local_b8.array_);
    pSVar1 = &(pVVar9->field_0).array_.index_;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if ((pVVar9->type_ != Object) || (local_a8 != '\x02')) {
      Value<char>::reset(pVVar9);
      pVVar9->type_ = Array;
      goto LAB_00118474;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = "<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x41;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",0x41,&local_c8)
  ;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"4, 1.5, ABC, true, false, null, ",0xb77);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 0;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 2;
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58.array_,"k1",2)
  ;
  pVVar9 = Value<char>::operator[](pVVar9,0);
  if (pVVar9->type_ != Object) {
    Value<char>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,"k3",2);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char>::reset(pVVar9);
    Value<char>::copyValue(pVVar9,(Value<char> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = "<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>";
  local_68 = 0x44;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",0x44,
             &local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[33]>
            (pQVar7,&local_98,(char (*) [33])"100, -50, A, true, false, null, ",0xb7e);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_58.array_);
  local_48 = 0;
  pVVar9 = Value<char>::operator[]((Value<char> *)&local_58.array_,0);
  if (pVVar9->type_ != Object) {
    Value<char>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,"k2",2);
  if (pVVar9->type_ != Array) {
    if ((pVVar9->type_ == Object) && (local_a8 == '\x02')) {
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar9,
                 (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
      goto LAB_00118705;
    }
    Value<char>::reset(pVVar9);
    pVVar9->type_ = Array;
  }
  uVar8 = (pVVar9->field_0).array_.index_;
  if (uVar8 == (pVVar9->field_0).array_.capacity_) {
    Array<Qentem::Value<char>_>::resize
              ((Array<Qentem::Value<char>_> *)pVVar9,(uVar8 == 0 | uVar8) * 2);
    uVar8 = (pVVar9->field_0).array_.index_;
  }
  pVVar2 = (pVVar9->field_0).array_.storage_ + uVar8;
  (pVVar2->field_0).array_.storage_ = (Value<char> *)0x0;
  *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
  *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
  pVVar2->type_ = Undefined;
  Value<char>::copyValue(pVVar2,(Value<char> *)&local_b8.array_);
  pSVar1 = &(pVVar9->field_0).array_.index_;
  *pSVar1 = *pSVar1 + 1;
LAB_00118705:
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  "<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>";
  local_68 = 0x55;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
             ,0x55,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[65]>
            (pQVar7,&local_98,
             (char (*) [65])"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",0xb86
            );
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char> *)&local_c8,
             "{\"group\":[[10],[20],[30]]}",0x1a);
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char>::operator=((Value<char> *)&local_58.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = 
  "<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
  ;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x59;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
             ,0x59,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(pQVar7,&local_98,(char (*) [7])"102030",0xb8c);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char> *)&local_c8,"{\"group\":[1,2,3,4]}",0x13
            );
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char>::operator=((Value<char> *)&local_58.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>";
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x30;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",0x30,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(pQVar7,&local_98,(char (*) [5])"1234",0xb92);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char> *)&local_c8,
             "{\"numbers\":[1,2,3,4,5,6,7,8]}",0x1d);
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char>::operator=((Value<char> *)&local_58.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B";
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x36;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",0x36,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (pQVar7,&local_98,(char (*) [11])"A12345678B",0xb97);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_70 = "<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>";
  local_68 = 0x37;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",0x37,&local_c8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_88.array_,&local_c8,(Value<char> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char>,char[113]>
            (pQVar7,&local_98,
             (char (*) [113])
             "{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9e);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char>::~Value((Value<char> *)&local_b8.array_);
  Value<char>::~Value((Value<char> *)&local_58.array_);
  Value<char>::~Value((Value<char> *)&local_e8.array_);
  pcVar6 = local_98.storage_;
  if (local_98.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.storage_);
  }
  operator_delete(pcVar6);
  return;
}

Assistant:

static void TestLoopTag1(QTest &test) {
    StringStream<char> ss;
    Value<char>        value1;
    Value<char>        value3;
    const char        *content;

    value1 += 100;
    value1 += -50;
    value1 += R"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = R"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 R"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        R"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 R"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = R"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        R"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(R"([100, -50, "A", true, false, null])");
    const Value<char> value2 =
        JSON::Parse(R"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[R"(arr1)"] = value1;

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[R"(arr1)"] = value2;

    content = R"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[R"(arr1)"] = value1;

    content = R"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = R"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[R"(arr1)"] = value2;

    content = R"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[R"(arr1)"][R"(arr2)"][R"(arr3)"] = value1;

    content = R"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = R"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[R"(k1)"][0][R"(k3)"] = value1;

    content = R"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][R"(k2)"] += value2;

    content = R"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 R"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(R"({"group":[[10],[20],[30]]})");

    content = R"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(R"({"group":[1,2,3,4]})");

    content = R"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), R"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(R"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = R"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), R"(A12345678B)", __LINE__);
    ss.Clear();

    content = R"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        R"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}